

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtosc.c
# Opt level: O0

size_t rtosc_bundle(char *buffer,size_t len,uint64_t tt,int elms,...)

{
  void *__src;
  size_t __n;
  int in_ECX;
  uint64_t in_RDX;
  size_t in_RSI;
  char *in_RDI;
  size_t size;
  char *msg;
  int i;
  va_list va;
  char *_buffer;
  undefined8 *local_130;
  size_t in_stack_fffffffffffffee8;
  char *in_stack_fffffffffffffef0;
  int local_4c;
  uint local_48;
  undefined8 *local_40;
  uint8_t *local_8;
  
  memset(in_RDI,0,in_RSI);
  strcpy(in_RDI,"#bundle");
  emplace_uint64((uint8_t *)(in_RDI + 8),in_RDX);
  local_8 = (uint8_t *)(in_RDI + 0x10);
  local_40 = (undefined8 *)&stack0x00000008;
  local_48 = 0x20;
  for (local_4c = 0; local_4c < in_ECX; local_4c = local_4c + 1) {
    if (local_48 < 0x29) {
      local_130 = (undefined8 *)(&stack0xfffffffffffffee8 + (int)local_48);
      local_48 = local_48 + 8;
    }
    else {
      local_130 = local_40;
      local_40 = local_40 + 1;
    }
    __src = (void *)*local_130;
    __n = rtosc_message_length(in_stack_fffffffffffffef0,in_stack_fffffffffffffee8);
    emplace_uint32(local_8,(uint32_t)__n);
    memcpy(local_8 + 4,__src,__n);
    local_8 = local_8 + 4 + __n;
  }
  return (long)local_8 - (long)in_RDI;
}

Assistant:

size_t rtosc_bundle(char *buffer, size_t len, uint64_t tt, int elms, ...)
{
    char *_buffer = buffer;
    memset(buffer, 0, len);
    strcpy(buffer, "#bundle");
    buffer += 8;
    emplace_uint64((uint8_t*)buffer, tt);
    buffer += 8;
    va_list va;
    va_start(va, elms);
    for(int i=0; i<elms; ++i) {
        const char   *msg  = va_arg(va, const char*);
        //It is assumed that any passed message/bundle is valid
        size_t        size = rtosc_message_length(msg, -1);
        emplace_uint32((uint8_t*)buffer, size);
        buffer += 4;
        memcpy(buffer, msg, size);
        buffer+=size;
    }
    va_end(va);

    return buffer-_buffer;
}